

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_index.h
# Opt level: O2

long __thiscall BufferIndex<double,_long>::find(BufferIndex<double,_long> *this,double key)

{
  BufferNode<double,_long> *this_00;
  long lVar1;
  self *psVar2;
  Buffer *this_01;
  double local_38;
  const_iterator local_30;
  
  local_38 = key;
  if (this->min_key <= key) {
    if (key <= this->max_key) {
      stx::
      btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
      ::upper_bound(&local_30,&this->btree,&local_38);
      psVar2 = stx::
               btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
               ::const_iterator::operator--(&local_30);
      this_00 = psVar2->currnode->slotdata[psVar2->currslot];
      (psVar2->temp_value).first = psVar2->currnode->slotkey[psVar2->currslot];
      (psVar2->temp_value).second = this_00;
      lVar1 = BufferNode<double,_long>::find(this_00,local_38);
      return lVar1;
    }
    this_01 = &this->right_buffer;
  }
  else {
    this_01 = &this->left_buffer;
  }
  lVar1 = Buffer::find(this_01,key);
  return lVar1;
}

Assistant:

P find(K key) const {
        if (!less_than(key, min_key) && !greater_than(key, max_key)) {
            return (--btree.upper_bound(key))->second->find(key);
        }
        else if (less_than(key, min_key)) {
            return left_buffer.find(key);
        }
        else {
            return right_buffer.find(key);
        }
    }